

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_analyze.cpp
# Opt level: O0

TokenType * type2str_abi_cxx11_(TokenType *type)

{
  undefined4 *in_RSI;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19 [9];
  TokenType *type_local;
  
  type_local = type;
  switch(*in_RSI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"Identifier",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"IntLiteral",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"Key",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"ASSIGN",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"GLT",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"GLE",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"Plus",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"Minus",&local_33);
    std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"Star",&local_34);
    std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"Slash",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"None",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"LBracket",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)type,"RBracket",&local_37);
    std::allocator<char>::~allocator((allocator<char> *)&local_37);
  }
  return type;
}

Assistant:

std::string type2str(const TokenType& type) {
    switch (type) {
        case ID_TYPE:
            return "Identifier";
        case INT_LITERAL_TYPE:
            return "IntLiteral";
        case ASSIGN_TYPE:
            return "ASSIGN";
        case GLT_TYPE:
            return "GLT";
        case GLE_TYPE:
            return "GLE";
        case KEY_TYPE:
            return "Key";
        case PLUS_TYPE:
            return "Plus";
        case MINUS_TYPE:
            return "Minus";
        case STAR_TYPE:
            return "Star";
        case SLASH_TYPE:
            return "Slash";
        case LBRACKET_TYPE:
            return "LBracket";
        case RBRACKET_TYPE:
            return "RBracket";
        default:
            return "None";
    }
}